

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O0

void __thiscall
ArgWrapper<char>::ArgWrapper<char_const*,char_const*>
          (ArgWrapper<char> *this,char *in_args,char *in_args_1)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a7;
  undefined1 local_a6;
  allocator<char> local_a5 [20];
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68 [32];
  undefined1 local_48 [40];
  char *local_20;
  char *in_args_local_1;
  char *in_args_local;
  ArgWrapper<char> *this_local;
  
  local_a6 = 1;
  local_90 = &local_88;
  local_20 = in_args_1;
  in_args_local_1 = in_args;
  in_args_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,in_args,&local_91);
  __s = local_20;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,__s,local_a5);
  local_a6 = 0;
  local_48._0_8_ = &local_88;
  local_48._8_8_ = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_a7);
  __l._M_len = local_48._8_8_;
  __l._M_array = (iterator)local_48._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_48 + 0x10),__l,&local_a7);
  ArgWrapper(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_48 + 0x10));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_48 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_a7);
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
  do {
    local_f0 = local_f0 + -1;
    std::__cxx11::string::~string((string *)local_f0);
  } while (local_f0 != &local_88);
  std::allocator<char>::~allocator(local_a5);
  std::allocator<char>::~allocator(&local_91);
  return;
}

Assistant:

ArgWrapper(Args... in_args)
		: ArgWrapper{ std::vector<std::basic_string<CharT>>{ in_args... } } {
		// Empty ctor body
	}